

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_ModRM.c
# Opt level: O3

size_t printSeparator(OPTYPE *pMyOperand,size_t i,PDISASM pMyDisasm)

{
  long lVar1;
  char *pcVar2;
  
  if ((pMyDisasm->Reserved_).SYNTAX_ == 0x400) {
    pcVar2 = pMyOperand->OpMnemonic + i;
    if ((pMyDisasm->Reserved_).BASE_ == 5) {
      builtin_strncpy(pMyOperand->OpMnemonic + i,"(,%",4);
      lVar1 = 3;
    }
    else {
      pcVar2[2] = '\0';
      pcVar2[0] = ',';
      pcVar2[1] = '%';
      lVar1 = 2;
    }
  }
  else {
    (pMyOperand->OpMnemonic + i)[0] = '+';
    (pMyOperand->OpMnemonic + i)[1] = '\0';
    lVar1 = 1;
  }
  return lVar1 + i;
}

Assistant:

size_t __bea_callspec__ printSeparator(OPTYPE* pMyOperand, size_t i, PDISASM pMyDisasm)
{
  if (GV.SYNTAX_ == ATSyntax) {
    if (GV.BASE_  == 5) {
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy((char*) pMyOperand->OpMnemonic+i, "(,%");
      #endif
      i+=3;
    }
    else {
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy((char*) pMyOperand->OpMnemonic+i, ",%");
      #endif
      i+=2;
    }
  }
  else {
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy((char*) pMyOperand->OpMnemonic+i, "+");
    #endif
    i+=1;
  }
  return i;
}